

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O2

void aom_highbd_quantize_b_64x64_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  uint *puVar2;
  short sVar3;
  ushort uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  __m128i *palVar15;
  ulong uVar16;
  long lVar17;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *qcoeff1;
  __m128i *qcoeff0;
  int *piVar18;
  long lVar19;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar20;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar24;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  __m128i alVar41;
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i mask;
  __m128i mask_00;
  __m128i dequant;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  uint local_1c0;
  int is_found0;
  undefined1 local_1b8 [16];
  int log_scale;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  tran_low_t *local_170;
  undefined1 local_168 [4];
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined1 local_158 [4];
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_150;
  ushort uStack_14e;
  ushort uStack_14c;
  ushort uStack_14a;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined8 local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  uint uStack_100;
  uint uStack_fc;
  int thresh [4];
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  __m128i mask0;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  intptr_t local_90;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  __m128i threshold [2];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  is_found0 = 0;
  log_scale = 2;
  mask0[0] = 0;
  mask0[1] = 0;
  auVar21 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  local_120 = CONCAT44((auVar21._4_4_ >> 0x10) + 2 >> 2,(auVar21._0_4_ >> 0x10) + 2 >> 2);
  for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
    thresh[lVar17] =
         (dequant_ptr[lVar17] * 0x145 + 0x40 >> 7) + *(int *)(local_118 + lVar17 * 4 + -8) * 0x20 +
         -1;
  }
  thresh[3] = thresh[1];
  thresh[2] = thresh[1];
  auVar7._4_4_ = thresh[1];
  auVar7._0_4_ = thresh[1];
  auVar7._8_4_ = thresh[1];
  _local_158 = auVar7._4_8_;
  register0x00001208 = thresh[1];
  register0x0000120c = thresh[1];
  auVar21 = *(undefined1 (*) [16])zbin_ptr;
  auVar23 = *(undefined1 (*) [16])round_ptr;
  auVar26 = *(undefined1 (*) [16])quant_ptr;
  local_198 = *(undefined1 (*) [16])dequant_ptr;
  auVar27 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar22 = psraw(auVar21,0xf);
  auVar25 = psraw(auVar23,0xf);
  auVar28 = psraw(auVar26,0xf);
  local_68 = psraw(local_198,0xf);
  auVar29 = psraw(auVar27,0xf);
  auVar40._0_12_ = auVar21._0_12_;
  auVar40._12_2_ = auVar21._6_2_;
  auVar40._14_2_ = auVar22._6_2_;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = auVar21._0_10_;
  auVar39._10_2_ = auVar22._4_2_;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = auVar21._0_8_;
  auVar38._8_2_ = auVar21._4_2_;
  auVar5._4_8_ = auVar38._8_8_;
  auVar5._2_2_ = auVar22._2_2_;
  auVar5._0_2_ = auVar21._2_2_;
  auVar37._0_12_ = auVar23._0_12_;
  auVar37._12_2_ = auVar23._6_2_;
  auVar37._14_2_ = auVar25._6_2_;
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = auVar23._0_10_;
  auVar36._10_2_ = auVar25._4_2_;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._0_8_ = auVar23._0_8_;
  auVar35._8_2_ = auVar23._4_2_;
  auVar6._4_8_ = auVar35._8_8_;
  auVar6._2_2_ = auVar25._2_2_;
  auVar6._0_2_ = auVar23._2_2_;
  auVar34._0_12_ = auVar26._0_12_;
  auVar34._12_2_ = auVar26._6_2_;
  auVar34._14_2_ = auVar28._6_2_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = auVar26._0_10_;
  auVar33._10_2_ = auVar28._4_2_;
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = auVar26._0_8_;
  auVar32._8_2_ = auVar26._4_2_;
  register0x00001348 = auVar32._8_8_;
  uStack_164._2_2_ = auVar28._2_2_;
  uStack_164._0_2_ = auVar26._2_2_;
  local_168._0_2_ = auVar26._0_2_;
  local_168._2_2_ = auVar28._0_2_;
  auVar31._0_12_ = auVar27._0_12_;
  auVar31._12_2_ = auVar27._6_2_;
  auVar31._14_2_ = auVar29._6_2_;
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = auVar27._0_10_;
  auVar30._10_2_ = auVar29._4_2_;
  auVar28._10_6_ = auVar30._10_6_;
  auVar28._0_8_ = auVar27._0_8_;
  auVar28._8_2_ = auVar27._4_2_;
  register0x00001308 = auVar28._8_8_;
  local_108._6_2_ = auVar29._2_2_;
  local_108._4_2_ = auVar27._2_2_;
  local_108._0_2_ = auVar27._0_2_;
  local_108._2_2_ = auVar29._0_2_;
  local_188._4_4_ = auVar5._0_4_ + 2U >> 2;
  local_188._0_4_ = CONCAT22(auVar22._0_2_,auVar21._0_2_) + 2U >> 2;
  local_188._8_4_ = auVar38._8_4_ + 2U >> 2;
  local_188._12_4_ = auVar39._12_4_ + 2U >> 2;
  local_e8 = CONCAT22(auVar25._0_2_,auVar23._0_2_) + 2U >> 2;
  uStack_e4 = auVar6._0_4_ + 2U >> 2;
  uStack_e0 = auVar35._8_4_ + 2U >> 2;
  uStack_dc = auVar36._12_4_ + 2U >> 2;
  local_118._4_4_ = uStack_e4;
  local_118._0_4_ = local_e8;
  local_118._8_4_ = uStack_e0;
  local_118._12_4_ = uStack_dc;
  local_88 = *coeff_ptr >> 0x1f;
  uStack_84 = coeff_ptr[1] >> 0x1f;
  uStack_80 = coeff_ptr[2] >> 0x1f;
  uStack_7c = coeff_ptr[3] >> 0x1f;
  local_78 = coeff_ptr[4] >> 0x1f;
  uStack_74 = coeff_ptr[5] >> 0x1f;
  uStack_70 = coeff_ptr[6] >> 0x1f;
  uStack_6c = coeff_ptr[7] >> 0x1f;
  local_138 = (*coeff_ptr ^ local_88) - local_88;
  uStack_134 = (coeff_ptr[1] ^ uStack_84) - uStack_84;
  uStack_130 = (coeff_ptr[2] ^ uStack_80) - uStack_80;
  uStack_12c = (coeff_ptr[3] ^ uStack_7c) - uStack_7c;
  qcoeff0 = (__m128i *)&local_138;
  local_148 = (coeff_ptr[4] ^ local_78) - local_78;
  uStack_144 = (coeff_ptr[5] ^ uStack_74) - uStack_74;
  uStack_140 = (coeff_ptr[6] ^ uStack_70) - uStack_70;
  uStack_13c = (coeff_ptr[7] ^ uStack_6c) - uStack_6c;
  local_1b8._4_4_ = uStack_144;
  local_1b8._0_4_ = local_148;
  local_1b8._8_4_ = uStack_140;
  local_1b8._12_4_ = uStack_13c;
  qcoeff1 = (__m128i *)&local_148;
  local_170 = coeff_ptr;
  local_d8 = local_138;
  uStack_d4 = uStack_134;
  uStack_d0 = uStack_130;
  uStack_cc = uStack_12c;
  _local_b8 = _local_108;
  _local_a8 = _local_168;
  local_90 = n_coeffs;
  threshold[1] = _local_158;
  highbd_update_mask0(qcoeff0,qcoeff1,threshold,iscan,&is_found0,&mask0);
  auVar23._0_4_ = -(uint)((int)local_d8 < (int)local_188._0_4_);
  auVar23._4_4_ = -(uint)((int)uStack_d4 < (int)local_188._4_4_);
  auVar23._8_4_ = -(uint)((int)uStack_d0 < (int)local_188._8_4_);
  auVar23._12_4_ = -(uint)((int)uStack_cc < (int)local_188._12_4_);
  auVar26._8_4_ = 0xffffffff;
  auVar26._0_8_ = 0xffffffffffffffff;
  auVar26._12_4_ = 0xffffffff;
  local_d8 = local_188._8_4_ + -1;
  uStack_d4 = local_188._12_4_ + -1;
  uStack_d0 = local_188._8_4_ + -1;
  uStack_cc = local_188._12_4_ + -1;
  auVar27._0_4_ = -(uint)((int)local_d8 < (int)local_1b8._0_4_);
  auVar27._4_4_ = -(uint)((int)uStack_d4 < (int)local_1b8._4_4_);
  auVar27._8_4_ = -(uint)((int)uStack_d0 < (int)local_1b8._8_4_);
  auVar27._12_4_ = -(uint)((int)uStack_cc < (int)local_1b8._12_4_);
  auVar21 = packssdw(auVar23 ^ auVar26,auVar27);
  uVar4 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar21[0xf] >> 7) << 0xf;
  uVar12 = (uint)uVar4;
  if (uVar4 == 0) {
    auVar21 = (undefined1  [16])0x0;
  }
  else {
    uVar12 = 1;
    auVar21 = auVar21 & *(undefined1 (*) [16])iscan;
  }
  local_1c0 = (uint)(uVar4 != 0);
  uVar8 = local_198._2_2_;
  uVar9 = local_198._4_2_;
  uVar10 = local_198._6_2_;
  threshold[0][0] = _local_158;
  threshold[0][1] = _uStack_150;
  iVar11 = movmskps(uVar12,auVar23 ^ auVar26 | auVar27);
  local_188 = auVar23;
  if (iVar11 == 0) {
    uVar20 = 0;
    uVar24 = 0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    local_e8 = local_118._8_4_;
    uStack_e4 = local_118._4_4_;
    uStack_e0 = local_118._8_4_;
    uStack_dc = local_118._4_4_;
    local_a8._4_4_ = uStack_164;
    local_a8._0_4_ = uStack_160;
    uStack_a0 = uStack_160;
    uStack_9c = uStack_164;
    local_b8._4_4_ = local_108._4_4_;
    local_b8._0_4_ = uStack_100;
    uStack_b0 = uStack_100;
    uStack_ac = local_108._4_4_;
    local_168._2_2_ = local_68._4_2_;
    local_168._0_2_ = local_198._4_2_;
    uStack_164._0_2_ = local_198._6_2_;
    uStack_164._2_2_ = local_68._6_2_;
    uStack_160._0_2_ = local_198._4_2_;
    uStack_160._2_2_ = local_68._4_2_;
    uStack_15c._0_2_ = local_198._6_2_;
    uStack_15c._2_2_ = local_68._6_2_;
  }
  else {
    qcoeff1 = (__m128i *)&local_e8;
    palVar15 = (__m128i *)local_b8;
    piVar18 = &log_scale;
    local_198._2_2_ = local_68._0_2_;
    local_198._4_2_ = uVar8;
    local_198._6_2_ = local_68._2_2_;
    local_198._8_2_ = uVar9;
    local_198._10_2_ = local_68._4_2_;
    local_198._12_2_ = uVar10;
    local_198._14_2_ = local_68._6_2_;
    local_1b8 = auVar27;
    _local_158 = (__m128i)auVar21;
    highbd_calculate_qcoeff((__m128i *)&local_138,qcoeff1,(__m128i *)local_a8,palVar15,piVar18);
    local_e8 = local_118._8_4_;
    uStack_e4 = local_118._4_4_;
    uStack_e0 = local_118._8_4_;
    uStack_dc = local_118._4_4_;
    local_a8._4_4_ = uStack_164;
    local_a8._0_4_ = uStack_160;
    uStack_a0 = uStack_160;
    uStack_9c = uStack_164;
    local_b8._4_4_ = local_108._4_4_;
    local_b8._0_4_ = uStack_100;
    uStack_b0 = uStack_100;
    uStack_ac = local_108._4_4_;
    highbd_calculate_qcoeff((__m128i *)&local_148,qcoeff1,(__m128i *)local_a8,palVar15,piVar18);
    local_1b8._0_4_ = local_1b8._0_4_ & (local_148 ^ local_78) - local_78;
    local_1b8._4_4_ = local_1b8._4_4_ & (uStack_144 ^ uStack_74) - uStack_74;
    local_1b8._8_4_ = local_1b8._8_4_ & (uStack_140 ^ uStack_70) - uStack_70;
    local_1b8._12_4_ = local_1b8._12_4_ & (uStack_13c ^ uStack_6c) - uStack_6c;
    *qcoeff_ptr = ~local_188._0_4_ & (local_138 ^ local_88) - local_88;
    qcoeff_ptr[1] = ~local_188._4_4_ & (uStack_134 ^ uStack_84) - uStack_84;
    qcoeff_ptr[2] = ~local_188._8_4_ & (uStack_130 ^ uStack_80) - uStack_80;
    qcoeff_ptr[3] = ~local_188._12_4_ & (uStack_12c ^ uStack_7c) - uStack_7c;
    qcoeff_ptr[4] = local_1b8._0_4_;
    qcoeff_ptr[5] = local_1b8._4_4_;
    qcoeff_ptr[6] = local_1b8._8_4_;
    qcoeff_ptr[7] = local_1b8._12_4_;
    alVar41[1] = (longlong)qcoeff1;
    alVar41[0] = 2;
    dequant[1] = (longlong)palVar15;
    dequant[0] = extraout_RDX;
    iVar11 = (int)piVar18;
    alVar41 = highbd_calculate_dqcoeff(alVar41,dequant,iVar11);
    dequant_00[0] = alVar41[1];
    local_188._8_8_ = extraout_XMM0_Qb;
    local_188._0_8_ = extraout_XMM0_Qa;
    uStack_164 = local_198._4_4_;
    local_168 = (undefined1  [4])local_198._8_4_;
    uStack_160 = local_198._8_4_;
    uStack_15c = local_198._4_4_;
    qcoeff0 = (__m128i *)0x2;
    qcoeff[1] = (longlong)qcoeff1;
    qcoeff[0] = 2;
    dequant_00[1] = (longlong)palVar15;
    highbd_calculate_dqcoeff(qcoeff,dequant_00,iVar11);
    *(undefined8 *)dqcoeff_ptr = local_188._0_8_;
    *(undefined8 *)(dqcoeff_ptr + 2) = local_188._8_8_;
    auVar21 = (undefined1  [16])_local_158;
    uVar20 = extraout_XMM0_Qa_00;
    uVar24 = extraout_XMM0_Qb_00;
  }
  local_158._0_2_ = (ushort)(-1 < auVar21._0_2_) * auVar21._0_2_;
  local_158._2_2_ = (ushort)(-1 < auVar21._2_2_) * auVar21._2_2_;
  uStack_154 = (ushort)(-1 < auVar21._4_2_) * auVar21._4_2_;
  uStack_152 = (ushort)(-1 < auVar21._6_2_) * auVar21._6_2_;
  uStack_150 = (ushort)(-1 < auVar21._8_2_) * auVar21._8_2_;
  uStack_14e = (ushort)(-1 < auVar21._10_2_) * auVar21._10_2_;
  uStack_14c = (ushort)(-1 < auVar21._12_2_) * auVar21._12_2_;
  uStack_14a = (ushort)(-1 < auVar21._14_2_) * auVar21._14_2_;
  *(undefined8 *)(dqcoeff_ptr + 4) = uVar20;
  *(undefined8 *)(dqcoeff_ptr + 6) = uVar24;
  lVar17 = 8;
  lVar19 = 0x10;
  while( true ) {
    if (local_90 <= lVar17) break;
    puVar1 = (uint *)(local_170 + lVar17);
    puVar2 = (uint *)(local_170 + lVar17 + 4);
    local_108._0_4_ = (int)*puVar1 >> 0x1f;
    local_108._4_4_ = (int)puVar1[1] >> 0x1f;
    uStack_100 = (int)puVar1[2] >> 0x1f;
    uStack_fc = (int)puVar1[3] >> 0x1f;
    local_188._0_4_ = (int)*puVar2 >> 0x1f;
    local_188._4_4_ = (int)puVar2[1] >> 0x1f;
    local_188._8_4_ = (int)puVar2[2] >> 0x1f;
    local_188._12_4_ = (int)puVar2[3] >> 0x1f;
    local_138 = (*puVar1 ^ local_108._0_4_) - local_108._0_4_;
    uStack_134 = (puVar1[1] ^ local_108._4_4_) - local_108._4_4_;
    uStack_130 = (puVar1[2] ^ uStack_100) - uStack_100;
    uStack_12c = (puVar1[3] ^ uStack_fc) - uStack_fc;
    local_198._4_4_ = uStack_134;
    local_198._0_4_ = local_138;
    local_198._8_4_ = uStack_130;
    local_198._12_4_ = uStack_12c;
    local_148 = (*puVar2 ^ local_188._0_4_) - local_188._0_4_;
    uStack_144 = (puVar2[1] ^ local_188._4_4_) - local_188._4_4_;
    uStack_140 = (puVar2[2] ^ local_188._8_4_) - local_188._8_4_;
    uStack_13c = (puVar2[3] ^ local_188._12_4_) - local_188._12_4_;
    local_1b8._4_4_ = uStack_144;
    local_1b8._0_4_ = local_148;
    local_1b8._8_4_ = uStack_140;
    local_1b8._12_4_ = uStack_13c;
    qcoeff1 = (__m128i *)&local_148;
    qcoeff0 = (__m128i *)&local_138;
    highbd_update_mask0((__m128i *)&local_138,qcoeff1,threshold,(int16_t *)((long)iscan + lVar19),
                        &is_found0,&mask0);
    auVar25._0_4_ = -(uint)((int)local_d8 < (int)local_198._0_4_);
    auVar25._4_4_ = -(uint)((int)uStack_d4 < (int)local_198._4_4_);
    auVar25._8_4_ = -(uint)((int)uStack_d0 < (int)local_198._8_4_);
    auVar25._12_4_ = -(uint)((int)uStack_cc < (int)local_198._12_4_);
    auVar22._0_4_ = -(uint)((int)local_d8 < (int)local_1b8._0_4_);
    auVar22._4_4_ = -(uint)((int)uStack_d4 < (int)local_1b8._4_4_);
    auVar22._8_4_ = -(uint)((int)uStack_d0 < (int)local_1b8._8_4_);
    auVar22._12_4_ = -(uint)((int)uStack_cc < (int)local_1b8._12_4_);
    auVar21 = packssdw(auVar25,auVar22);
    uVar4 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
            (ushort)(byte)(auVar21[0xf] >> 7) << 0xf;
    uVar12 = (uint)uVar4;
    if (uVar4 == 0) {
      auVar21 = (undefined1  [16])0x0;
    }
    else {
      auVar21 = auVar21 & *(undefined1 (*) [16])(iscan + lVar17);
      uVar12 = 1;
      local_1c0 = uVar12;
    }
    iVar11 = movmskps(uVar12,auVar22 | auVar25);
    if (iVar11 == 0) {
      *(undefined1 (*) [16])(qcoeff_ptr + lVar17 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar17) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar17 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar17) = (undefined1  [16])0x0;
    }
    else {
      palVar15 = (__m128i *)local_b8;
      piVar18 = &log_scale;
      local_1b8 = auVar22;
      local_198 = auVar25;
      local_118 = auVar21;
      highbd_calculate_qcoeff
                ((__m128i *)&local_138,(__m128i *)&local_e8,(__m128i *)local_a8,palVar15,piVar18);
      qcoeff1 = (__m128i *)&local_e8;
      highbd_calculate_qcoeff((__m128i *)&local_148,qcoeff1,(__m128i *)local_a8,palVar15,piVar18);
      local_138 = local_198._0_4_ & (local_138 ^ local_108._0_4_) - local_108._0_4_;
      uStack_134 = local_198._4_4_ & (uStack_134 ^ local_108._4_4_) - local_108._4_4_;
      uStack_130 = local_198._8_4_ & (uStack_130 ^ uStack_100) - uStack_100;
      uStack_12c = local_198._12_4_ & (uStack_12c ^ uStack_fc) - uStack_fc;
      local_148 = local_1b8._0_4_ & (local_148 ^ local_188._0_4_) - local_188._0_4_;
      uStack_144 = local_1b8._4_4_ & (uStack_144 ^ local_188._4_4_) - local_188._4_4_;
      uStack_140 = local_1b8._8_4_ & (uStack_140 ^ local_188._8_4_) - local_188._8_4_;
      uStack_13c = local_1b8._12_4_ & (uStack_13c ^ local_188._12_4_) - local_188._12_4_;
      local_1b8._4_4_ = uStack_144;
      local_1b8._0_4_ = local_148;
      local_1b8._8_4_ = uStack_140;
      local_1b8._12_4_ = uStack_13c;
      puVar1 = (uint *)(qcoeff_ptr + lVar17);
      *puVar1 = local_138;
      puVar1[1] = uStack_134;
      puVar1[2] = uStack_130;
      puVar1[3] = uStack_12c;
      puVar1 = (uint *)(qcoeff_ptr + lVar17 + 4);
      *puVar1 = local_148;
      puVar1[1] = uStack_144;
      puVar1[2] = uStack_140;
      puVar1[3] = uStack_13c;
      qcoeff_00[1] = (longlong)qcoeff1;
      qcoeff_00[0] = 2;
      dequant_01[1] = (longlong)palVar15;
      dequant_01[0] = extraout_RDX_00;
      iVar11 = (int)piVar18;
      alVar41 = highbd_calculate_dqcoeff(qcoeff_00,dequant_01,iVar11);
      dequant_02[0] = alVar41[1];
      local_198._8_8_ = extraout_XMM0_Qb_01;
      local_198._0_8_ = extraout_XMM0_Qa_01;
      qcoeff0 = (__m128i *)0x2;
      qcoeff_01[1] = (longlong)qcoeff1;
      qcoeff_01[0] = 2;
      dequant_02[1] = (longlong)palVar15;
      highbd_calculate_dqcoeff(qcoeff_01,dequant_02,iVar11);
      *(undefined8 *)(dqcoeff_ptr + lVar17) = local_198._0_8_;
      *(undefined8 *)(dqcoeff_ptr + lVar17 + 2) = local_198._8_8_;
      *(undefined8 *)(dqcoeff_ptr + lVar17 + 4) = extraout_XMM0_Qa_02;
      *(undefined8 *)(dqcoeff_ptr + lVar17 + 4 + 2) = extraout_XMM0_Qb_02;
      auVar21 = local_118;
    }
    sVar3 = auVar21._0_2_;
    local_158._0_2_ =
         (ushort)((short)local_158._0_2_ < sVar3) * sVar3 |
         (ushort)((short)local_158._0_2_ >= sVar3) * local_158._0_2_;
    sVar3 = auVar21._2_2_;
    local_158._2_2_ =
         (ushort)((short)local_158._2_2_ < sVar3) * sVar3 |
         (ushort)((short)local_158._2_2_ >= sVar3) * local_158._2_2_;
    sVar3 = auVar21._4_2_;
    uStack_154 = (ushort)((short)uStack_154 < sVar3) * sVar3 |
                 ((short)uStack_154 >= sVar3) * uStack_154;
    sVar3 = auVar21._6_2_;
    uStack_152 = (ushort)((short)uStack_152 < sVar3) * sVar3 |
                 ((short)uStack_152 >= sVar3) * uStack_152;
    sVar3 = auVar21._8_2_;
    uStack_150 = (ushort)((short)uStack_150 < sVar3) * sVar3 |
                 ((short)uStack_150 >= sVar3) * uStack_150;
    sVar3 = auVar21._10_2_;
    uStack_14e = (ushort)((short)uStack_14e < sVar3) * sVar3 |
                 ((short)uStack_14e >= sVar3) * uStack_14e;
    sVar3 = auVar21._12_2_;
    uStack_14c = (ushort)((short)uStack_14c < sVar3) * sVar3 |
                 ((short)uStack_14c >= sVar3) * uStack_14c;
    sVar3 = auVar21._14_2_;
    uStack_14a = (ushort)((short)uStack_14a < sVar3) * sVar3 |
                 ((short)uStack_14a >= sVar3) * uStack_14a;
    lVar17 = lVar17 + 8;
    lVar19 = lVar19 + 0x10;
  }
  if (is_found0 == 0) {
    uVar12 = 0;
  }
  else {
    mask[1] = (longlong)qcoeff1;
    mask[0] = (longlong)qcoeff0;
    uVar12 = calculate_non_zero_count(mask);
  }
  if (local_1c0 == 0) {
    uVar13 = 0xffffffff;
  }
  else {
    mask_00[1] = (longlong)qcoeff1;
    mask_00[0] = (longlong)qcoeff0;
    iVar11 = calculate_non_zero_count(mask_00);
    uVar13 = iVar11 - 1;
  }
  for (; (int)uVar12 <= (int)uVar13; uVar13 = uVar13 - 1) {
    sVar3 = scan[uVar13];
    qcoeff_ptr[sVar3] = 0;
    dqcoeff_ptr[sVar3] = 0;
  }
  uVar13 = uVar12 + 1;
  uVar16 = (ulong)uVar12;
  do {
    if ((long)uVar16 < 1) {
      uVar13 = 0;
      break;
    }
    lVar17 = uVar16 - 1;
    uVar16 = uVar16 - 1;
    uVar13 = uVar13 - 1;
  } while (qcoeff_ptr[scan[lVar17]] == 0);
  *eob_ptr = (uint16_t)uVar13;
  uVar16 = 0;
  uVar14 = 0xffffffff;
  do {
    if (uVar12 == uVar16) {
LAB_002c49f3:
      if (((uint16_t)uVar13 != 0) && (uVar14 == (uVar13 & 0xffff) - 1)) {
        sVar3 = scan[uVar14];
        if (((qcoeff_ptr[sVar3] == 1) || (qcoeff_ptr[sVar3] == -1)) &&
           (uVar12 = local_170[sVar3] >> 0x1f,
           (int)((local_170[sVar3] << 5 ^ uVar12) - uVar12) <
           *(int *)(local_118 + (ulong)(sVar3 != 0) * 4 + -8) * 0x20 +
           (dequant_ptr[sVar3 != 0] * 0x20d + 0x40 >> 7))) {
          qcoeff_ptr[sVar3] = 0;
          dqcoeff_ptr[sVar3] = 0;
          *eob_ptr = 0;
        }
      }
      return;
    }
    if (qcoeff_ptr[scan[uVar16]] != 0) {
      uVar14 = (uint)uVar16;
      goto LAB_002c49f3;
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void aom_highbd_quantize_b_64x64_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 2;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  const __m128i log_scale_vec = _mm_set1_epi32(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);

  // Shift with rounding.
  zbin = _mm_add_epi32(zbin, log_scale_vec);
  round = _mm_add_epi32(round, log_scale_vec);
  zbin = _mm_srli_epi32(zbin, log_scale);
  round = _mm_srli_epi32(round, log_scale);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}